

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::MultipleBindingCase::genTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int flags)

{
  ostringstream local_198 [8];
  ostringstream buf;
  int flags_local;
  MultipleBindingCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"draw test pattern");
  if ((flags & 1U) != 0) {
    std::operator<<((ostream *)local_198,", zero stride");
  }
  if ((flags & 2U) != 0) {
    std::operator<<((ostream *)local_198,", instanced binding point");
  }
  if ((flags & 4U) != 0) {
    std::operator<<((ostream *)local_198,", binding points share buffer object");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string MultipleBindingCase::genTestDescription (int flags) const
{
	std::ostringstream buf;
	buf << "draw test pattern";

	if (flags & FLAG_ZERO_STRIDE)
		buf << ", zero stride";
	if (flags & FLAG_INSTANCED)
		buf << ", instanced binding point";
	if (flags & FLAG_ALIASING_BUFFERS)
		buf << ", binding points share buffer object";

	return buf.str();
}